

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

unsigned_long * __thiscall
google::protobuf::internal::GeneratedMessageReflection::MutableRaw<unsigned_long>
          (GeneratedMessageReflection *this,Message *message,FieldDescriptor *field)

{
  int *piVar1;
  char *pcVar2;
  
  piVar1 = this->offsets_;
  pcVar2 = FieldDescriptor::index(field,(char *)message,(int)field);
  return (unsigned_long *)
         ((long)&(message->super_MessageLite)._vptr_MessageLite + (long)piVar1[(int)pcVar2]);
}

Assistant:

inline Type* GeneratedMessageReflection::MutableRaw(
    Message* message, const FieldDescriptor* field) const {
  void* ptr = reinterpret_cast<uint8*>(message) + offsets_[field->index()];
  return reinterpret_cast<Type*>(ptr);
}